

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall Highs::writeBasis(Highs *this,string *filename)

{
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *this_00;
  pointer pcVar1;
  HighsStatus HVar2;
  int iVar3;
  FILE *file;
  HighsFileType file_type;
  FILE *local_f8;
  HighsFileType local_ec;
  string local_e8;
  string local_c8;
  string local_a8;
  HighsLogOptions local_88;
  
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar1,pcVar1 + filename->_M_string_length);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"writebasis","");
  HVar2 = openWriteFile(this,&local_a8,&local_c8,(FILE **)&local_f8,&local_ec);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_88.log_stream = (this->options_).super_HighsOptionsStruct.log_options.log_stream;
  local_88.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
  local_88.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console;
  local_88.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
  local_88.user_log_callback =
       (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
  local_88.user_log_callback_data =
       (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
  this_00 = &local_88.user_callback;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::function(this_00,&(this->options_).super_HighsOptionsStruct.log_options.user_callback);
  local_88.user_callback_active =
       (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
  local_88.user_callback_data =
       (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"openWriteFile","");
  HVar2 = interpretCallStatus(&local_88,HVar2,kOk,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (local_88.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_88.user_callback.super__Function_base._M_manager)
              ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
  }
  if (HVar2 != kError) {
    iVar3 = std::__cxx11::string::compare((char *)filename);
    if (iVar3 != 0) {
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                   "Writing the basis to %s\n",(filename->_M_dataplus)._M_p);
    }
    writeBasisFile((FILE **)&local_f8,&this->basis_);
    if (local_f8 != _stdout) {
      fclose(local_f8);
    }
  }
  return HVar2;
}

Assistant:

HighsStatus Highs::writeBasis(const std::string& filename) const {
  HighsStatus return_status = HighsStatus::kOk;
  HighsStatus call_status;
  FILE* file;
  HighsFileType file_type;
  call_status = openWriteFile(filename, "writebasis", file, file_type);
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "openWriteFile");
  if (return_status == HighsStatus::kError) return return_status;
  // Report to user that basis is being written
  if (filename != "")
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "Writing the basis to %s\n", filename.c_str());
  writeBasisFile(file, basis_);
  if (file != stdout) fclose(file);
  return return_status;
}